

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall SQLite::Statement::bindNoCopy(Statement *this,char *apName,string *aValue)

{
  int iVar1;
  int nData;
  sqlite3_stmt *psVar2;
  char *zData;
  int ret;
  int index;
  string *aValue_local;
  char *apName_local;
  Statement *this_local;
  
  psVar2 = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  iVar1 = sqlite3_bind_parameter_index(psVar2,apName);
  psVar2 = Ptr::operator_cast_to_sqlite3_stmt_(&this->mStmtPtr);
  zData = (char *)std::__cxx11::string::c_str();
  nData = std::__cxx11::string::size();
  iVar1 = sqlite3_bind_text(psVar2,iVar1,zData,nData,(_func_void_void_ptr *)0x0);
  check(this,iVar1);
  return;
}

Assistant:

void Statement::bindNoCopy(const char* apName, const std::string& aValue)
{
    const int index = sqlite3_bind_parameter_index(mStmtPtr, apName);
    const int ret = sqlite3_bind_text(mStmtPtr, index, aValue.c_str(),
                                      static_cast<int>(aValue.size()), SQLITE_STATIC);
    check(ret);
}